

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

int __thiscall QTextEditPrivate::init(QTextEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *pQVar1;
  QWidgetTextControl *pQVar2;
  QWidgetTextControl *this_00;
  QPalette *pal;
  undefined4 *puVar3;
  QSizeF *pQVar4;
  QPaintDevice *pQVar5;
  ConnectionType CVar6;
  long in_FS_OFFSET;
  int *piVar7;
  ulong uVar8;
  code *local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  QObject local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  this_00 = (QWidgetTextControl *)operator_new(0x18);
  QTextEditControl::QTextEditControl((QTextEditControl *)this_00,&pQVar1->super_QObject);
  this->control = (QWidgetTextControl *)this_00;
  pal = QWidget::palette(pQVar1);
  QWidgetTextControl::setPalette(this_00,pal);
  local_b8 = adjustScrollbars;
  uStack_b0 = 0;
  CVar6 = (ConnectionType)this;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(QSizeF_const&),void(QTextEditPrivate::*)()>
            ((Object *)local_a8,(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::documentSizeChanged,0,CVar6);
  local_b8 = repaintContents;
  uStack_b0 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QRectF_const&),void(QTextEditPrivate::*)(QRectF_const&)>
            ((Object *)(local_a8 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::updateRequest,0,CVar6);
  local_b8 = ensureVisible;
  uStack_b0 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QRectF_const&),void(QTextEditPrivate::*)(QRectF_const&)>
            ((Object *)local_98,(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::visibilityRequest,0,CVar6);
  local_b8 = hoveredBlockWithMarkerChanged;
  uStack_b0 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QTextBlock_const&),void(QTextEditPrivate::*)(QTextBlock_const&)>
            ((Object *)(local_98 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::blockMarkerHovered,0,CVar6);
  local_b8 = cursorPositionChanged;
  uStack_b0 = 0;
  uVar8 = 0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(),void(QTextEditPrivate::*)()>
            ((Object *)local_88,(offset_in_QWidgetTextControl_to_subr)this->control,
             (Object *)QWidgetTextControl::cursorPositionChanged,0,CVar6);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::microFocusChanged;
  uStack_b0 = 0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtextedit.cpp:143:29),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar3 + 4) = pQVar1;
  piVar7 = (int *)(uVar8 & 0xffffffff00000000);
  QObject::connectImpl
            ((QObject *)(local_88 + 8),(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar3,piVar7,(QMetaObject *)0x0);
  uVar8 = (ulong)piVar7 & 0xffffffff00000000;
  CVar6 = (ConnectionType)pQVar1;
  QObject::
  connect<void(QWidgetTextControl::*)(QTextCharFormat_const&),void(QTextEdit::*)(QTextCharFormat_const&)>
            ((Object *)local_78,(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::currentCharFormatChanged,
             (offset_in_QTextEdit_to_subr *)0x0,CVar6);
  uVar8 = uVar8 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(),void(QTextEdit::*)()>
            ((Object *)(local_78 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::textChanged,(offset_in_QTextEdit_to_subr *)0x0,CVar6
            );
  uVar8 = uVar8 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QTextEdit::*)(bool)>
            ((Object *)local_68,(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::undoAvailable,(offset_in_QTextEdit_to_subr *)0x0,
             CVar6);
  uVar8 = uVar8 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QTextEdit::*)(bool)>
            ((Object *)(local_68 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::redoAvailable,(offset_in_QTextEdit_to_subr *)0x0,
             CVar6);
  uVar8 = uVar8 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QTextEdit::*)(bool)>
            ((Object *)local_58,(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::copyAvailable,(offset_in_QTextEdit_to_subr *)0x0,
             CVar6);
  uVar8 = uVar8 & 0xffffffff00000000;
  QObject::connect<void(QWidgetTextControl::*)(),void(QTextEdit::*)()>
            ((Object *)(local_58 + 8),(offset_in_QWidgetTextControl_to_subr)this->control,
             (ContextType *)QWidgetTextControl::selectionChanged,(offset_in_QTextEdit_to_subr *)0x0,
             CVar6);
  pQVar2 = this->control;
  local_b8 = QWidgetTextControl::textChanged;
  uStack_b0 = 0;
  puVar3 = (undefined4 *)operator_new(0x18);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtextedit.cpp:157:29),_QtPrivate::List<>,_void>
       ::impl;
  *(QWidget **)(puVar3 + 4) = pQVar1;
  QObject::connectImpl
            (local_48,(void **)pQVar2,(QObject *)&local_b8,(void **)pQVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)(uVar8 & 0xffffffff00000000),(QMetaObject *)0x0);
  std::array<QMetaObject::Connection,_13UL>::operator=
            (&this->connections,(array<QMetaObject::Connection,_13UL> *)local_a8);
  std::array<QMetaObject::Connection,_13UL>::~array
            ((array<QMetaObject::Connection,_13UL> *)local_a8);
  pQVar4 = (QSizeF *)QWidgetTextControl::document((QWidgetTextControl *)this->control);
  local_a8._0_8_ = (QCursorData *)0x0;
  local_a8._8_8_ = 0;
  QTextDocument::setPageSize(pQVar4);
  pQVar5 = (QPaintDevice *)QTextDocument::documentLayout();
  QAbstractTextDocumentLayout::setPaintDevice(pQVar5);
  QTextDocument::setDefaultFont((QFont *)pQVar4);
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar4,0));
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar4,0));
  if (*(long *)(ctx + 0x10) != 0) {
    QWidgetTextControl::setHtml((QWidgetTextControl *)this->control,(QString *)ctx);
  }
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0x14);
  QAbstractSlider::setSingleStep
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0x14);
  QWidget::setBackgroundRole((this->super_QAbstractScrollAreaPrivate).viewport,Base);
  QWidget::setMouseTracking(pQVar1,true);
  QWidget::setAcceptDrops(pQVar1,true);
  QWidget::setFocusPolicy(pQVar1,StrongFocus);
  QWidget::setAttribute(pQVar1,WA_KeyCompression,true);
  QWidget::setAttribute(pQVar1,WA_InputMethodEnabled,true);
  QWidget::setInputMethodHints(pQVar1,(InputMethodHints)0x400);
  pQVar1 = (this->super_QAbstractScrollAreaPrivate).viewport;
  QCursor::QCursor((QCursor *)local_a8,IBeamCursor);
  QWidget::setCursor(pQVar1,(QCursor *)local_a8);
  QCursor::~QCursor((QCursor *)local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::init(const QString &html)
{
    Q_Q(QTextEdit);
    control = new QTextEditControl(q);
    control->setPalette(q->palette());

    connections = {
        QObjectPrivate::connect(control, &QTextEditControl::documentSizeChanged,
                                this, &QTextEditPrivate::adjustScrollbars),
        QObjectPrivate::connect(control, &QTextEditControl::updateRequest,
                                this, &QTextEditPrivate::repaintContents),
        QObjectPrivate::connect(control, &QTextEditControl::visibilityRequest,
                                this, &QTextEditPrivate::ensureVisible),
        QObjectPrivate::connect(control, &QTextEditControl::blockMarkerHovered,
                                this, &QTextEditPrivate::hoveredBlockWithMarkerChanged),
        QObjectPrivate::connect(control, &QTextEditControl::cursorPositionChanged,
                                this, &QTextEditPrivate::cursorPositionChanged),
        QObject::connect(control, &QTextEditControl::microFocusChanged,
                         q, [q]() { q->updateMicroFocus(); }),
        QObject::connect(control, &QTextEditControl::currentCharFormatChanged,
                         q, &QTextEdit::currentCharFormatChanged),
        QObject::connect(control, &QTextEditControl::textChanged,
                         q, &QTextEdit::textChanged),
        QObject::connect(control, &QTextEditControl::undoAvailable,
                         q, &QTextEdit::undoAvailable),
        QObject::connect(control, &QTextEditControl::redoAvailable,
                         q, &QTextEdit::redoAvailable),
        QObject::connect(control, &QTextEditControl::copyAvailable,
                         q, &QTextEdit::copyAvailable),
        QObject::connect(control, &QTextEditControl::selectionChanged,
                         q, &QTextEdit::selectionChanged),
        QObject::connect(control, &QTextEditControl::textChanged,
                         q, [q]() { q->updateMicroFocus(); }),
    };

    QTextDocument *doc = control->document();
    // set a null page size initially to avoid any relayouting until the textedit
    // is shown. relayoutDocument() will take care of setting the page size to the
    // viewport dimensions later.
    doc->setPageSize(QSize(0, 0));
    doc->documentLayout()->setPaintDevice(viewport);
    doc->setDefaultFont(q->font());
    doc->setUndoRedoEnabled(false); // flush undo buffer.
    doc->setUndoRedoEnabled(true);

    if (!html.isEmpty())
        control->setHtml(html);

    hbar->setSingleStep(20);
    vbar->setSingleStep(20);

    viewport->setBackgroundRole(QPalette::Base);
    q->setMouseTracking(true);
    q->setAcceptDrops(true);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setAttribute(Qt::WA_KeyCompression);
    q->setAttribute(Qt::WA_InputMethodEnabled);
    q->setInputMethodHints(Qt::ImhMultiLine);
#ifndef QT_NO_CURSOR
    viewport->setCursor(Qt::IBeamCursor);
#endif
}